

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O3

void __thiscall
vkt::compute::anon_unknown_0::BufferToBufferInvertTest::initPrograms
          (BufferToBufferInvertTest *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  ProgramSources *pPVar2;
  ostringstream src;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  string local_1e0;
  uint local_1c0;
  value_type local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  if (this->m_bufferType == BUFFER_TYPE_SSBO) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"#version 310 es\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"layout (local_size_x = ",0x17);
    poVar1 = (ostream *)std::ostream::operator<<(local_198,(this->m_localSize).m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", local_size_y = ",0x11);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", local_size_z = ",0x11);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[2]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") in;\n",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"layout(binding = 0, std140) readonly buffer Input {\n",0x34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    uint values[",0x10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} sb_in;\n",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"layout (binding = 1, std140) writeonly buffer Output {\n",0x37);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    uint values[",0x10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} sb_out;\n",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void) {\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "    uint numValuesPerInv = uint(sb_in.values.length()) / (size.x*size.y*size.z);\n",
               0x51);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
               ,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    uint offset          = numValuesPerInv*groupNdx;\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n",0x36);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"        sb_out.values[offset + ndx] = ~sb_in.values[offset + ndx];\n",0x43);
  }
  else {
    if (this->m_bufferType != BUFFER_TYPE_UNIFORM) goto LAB_0070be4a;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"#version 310 es\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"layout (local_size_x = ",0x17);
    poVar1 = (ostream *)std::ostream::operator<<(local_198,(this->m_localSize).m_data[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", local_size_y = ",0x11);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", local_size_z = ",0x11);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[2]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") in;\n",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"layout(binding = 0) readonly uniform Input {\n",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    uint values[",0x10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} ub_in;\n",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"layout(binding = 1, std140) writeonly buffer Output {\n",0x36);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    uint values[",0x10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} sb_out;\n",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"void main (void) {\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n",
               0x51);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
               ,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    uint offset          = numValuesPerInv*groupNdx;\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n",0x36);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n",0x43);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n",2);
LAB_0070be4a:
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"comp","");
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  local_1c0 = 5;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_200,local_1f8 + (long)local_200);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar2->sources + local_1c0,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void BufferToBufferInvertTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	if (m_bufferType == BUFFER_TYPE_UNIFORM)
	{
		src << "#version 310 es\n"
			<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
			<< "layout(binding = 0) readonly uniform Input {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} ub_in;\n"
			<< "layout(binding = 1, std140) writeonly buffer Output {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_out;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n"
			<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "    uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n"
			<< "}\n";
	}
	else if (m_bufferType == BUFFER_TYPE_SSBO)
	{
		src << "#version 310 es\n"
			<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
			<< "layout(binding = 0, std140) readonly buffer Input {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_in;\n"
			<< "layout (binding = 1, std140) writeonly buffer Output {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_out;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint numValuesPerInv = uint(sb_in.values.length()) / (size.x*size.y*size.z);\n"
			<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "    uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "        sb_out.values[offset + ndx] = ~sb_in.values[offset + ndx];\n"
			<< "}\n";
	}

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}